

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

CharClass<wchar_t> * __thiscall
Centaurus::CharClass<wchar_t>::operator|=(CharClass<wchar_t> *this,Range<wchar_t> *r)

{
  CharClass<wchar_t> *pCVar1;
  Range<wchar_t> local_48;
  CharClass<wchar_t> local_38;
  Range<wchar_t> *local_18;
  Range<wchar_t> *r_local;
  CharClass<wchar_t> *this_local;
  
  local_18 = r;
  r_local = (Range<wchar_t> *)this;
  Range<wchar_t>::Range(&local_48,r);
  operator|(&local_38,this,&local_48);
  pCVar1 = operator=(this,&local_38);
  ~CharClass(&local_38);
  Range<wchar_t>::~Range(&local_48);
  return pCVar1;
}

Assistant:

CharClass<TCHAR>& operator|=(const Range<TCHAR>& r)
    {
        return *this = *this | r;
    }